

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp0_fast_iVar5(uint *pInOut,int nWords,int *pDifStart)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar2 = nWords * 2;
  iVar1 = 0;
  do {
    uVar3 = iVar2 - 1;
    if ((int)uVar3 < 0) {
      iVar2 = 0;
LAB_0048a289:
      *pDifStart = iVar2;
      return iVar1;
    }
    iVar4 = -(uint)(pInOut[uVar3] < pInOut[(ulong)uVar3 - 3]);
    if (pInOut[(ulong)uVar3 - 3] < pInOut[uVar3]) {
      iVar4 = 1;
    }
    if (iVar4 != 0) {
      if (iVar4 != -1) {
        iVar1 = 3;
      }
      goto LAB_0048a289;
    }
    iVar2 = iVar2 + -4;
  } while( true );
}

Assistant:

int minTemp0_fast_iVar5(unsigned* pInOut, int nWords, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp0_fast_iVar5\n");
    for(i=(nWords)*2 - 1; i>=0; i-=4)   
    {
        temp = CompareWords(pInOut[i],pInOut[i-3]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+1;
            return 0;
        }
        else
        {
            *pDifStart = i+1;
            return 3;
        }
    }
    *pDifStart=0;
    return 0;
}